

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  short *psVar1;
  ushort uVar2;
  short sVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  int iVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  float fVar9;
  StbUndoRecord *pSVar10;
  ImGuiContext *pIVar11;
  float fVar12;
  bool bVar13;
  int temp;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  ImWchar *pIVar19;
  unsigned_short *puVar20;
  int *piVar21;
  int temp_1;
  int iVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  float *pfVar26;
  ImFont *in_R8;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  bool bVar31;
  bool bVar32;
  float fVar33;
  float fVar34;
  ImWchar ch;
  float local_50 [3];
  uint local_44;
  uint local_40;
  uint local_3c;
  ImWchar *local_38;
  
  state = &this->Stb;
LAB_0021f67a:
  switch(key) {
  case 0x200000:
    iVar16 = (this->Stb).select_start;
    iVar30 = (this->Stb).select_end;
    if (iVar16 == iVar30) {
      if (0 < state->cursor) {
        state->cursor = state->cursor + -1;
      }
    }
    else {
      if (iVar30 < iVar16) {
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar30;
      }
      iVar16 = (this->Stb).select_start;
      (this->Stb).cursor = iVar16;
      (this->Stb).select_end = iVar16;
      (this->Stb).has_preferred_x = '\0';
    }
    goto LAB_00220131;
  case 0x200001:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      state->cursor = state->cursor + 1;
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
    }
    ImStb::stb_textedit_clamp(this,state);
    goto LAB_00220131;
  case 0x200002:
  case 0x20000e:
switchD_0021f694_caseD_200002:
    iVar16 = 1;
    bVar13 = (key & 0xffbfffffU) == 0x20000e;
    if (bVar13) {
      iVar16 = (this->Stb).row_count_per_page;
    }
    bVar32 = (this->Stb).single_line == '\0';
    if (bVar13 || bVar32) {
      iVar30 = (this->Stb).select_start;
      iVar22 = (this->Stb).select_end;
      if ((key & 0x400000U) == 0) {
        if (iVar30 != iVar22) {
          if (iVar22 < iVar30) {
            (this->Stb).select_end = iVar30;
            (this->Stb).select_start = iVar22;
          }
          iVar30 = (this->Stb).select_start;
          (this->Stb).cursor = iVar30;
          (this->Stb).select_end = iVar30;
          (this->Stb).has_preferred_x = '\0';
        }
      }
      else if (iVar30 == iVar22) {
        iVar30 = (this->Stb).cursor;
        (this->Stb).select_end = iVar30;
        (this->Stb).select_start = iVar30;
      }
      else {
        state->cursor = iVar22;
      }
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_find_charpos
                ((ImStb *)local_50,(StbFindState *)this,
                 (ImGuiInputTextState *)(ulong)(uint)(this->Stb).cursor,
                 (uint)(this->Stb).single_line,(int)in_R8);
      fVar12 = local_50[0];
      uVar14 = local_44;
      uVar29 = local_3c;
      if (0 < iVar16) {
        iVar30 = 0;
        uVar28 = local_3c;
        do {
          uVar29 = uVar28;
          fVar33 = fVar12;
          if ((this->Stb).has_preferred_x != '\0') {
            fVar33 = (this->Stb).preferred_x;
          }
          if (uVar29 == uVar14) break;
          (this->Stb).cursor = uVar29;
          puVar20 = (this->TextW).Data;
          local_38 = (ImWchar *)0x0;
          pIVar19 = puVar20 + (int)uVar29;
          InputTextCalcTextSizeW
                    (pIVar19,puVar20 + this->CurLenW,&local_38,(ImVec2 *)0x1,SUB81(in_R8,0));
          pIVar11 = GImGui;
          uVar14 = (uint)((ulong)((long)local_38 - (long)pIVar19) >> 1);
          if (0 < (int)uVar14) {
            puVar20 = (this->TextW).Data;
            iVar22 = (this->Stb).cursor;
            fVar34 = 0.0;
            uVar27 = 1;
            do {
              uVar2 = puVar20[(long)(int)uVar29 + (uVar27 - 1)];
              fVar9 = -1.0;
              if (uVar2 != 10) {
                in_R8 = pIVar11->Font;
                pfVar26 = &in_R8->FallbackAdvanceX;
                if ((int)(uint)uVar2 < (in_R8->IndexAdvanceX).Size) {
                  pfVar26 = (float *)((ulong)((uint)uVar2 * 4) + (long)(in_R8->IndexAdvanceX).Data);
                }
                fVar9 = (pIVar11->FontSize / in_R8->FontSize) * *pfVar26;
              }
              if (((fVar9 == -1.0) && (!NAN(fVar9))) || (fVar34 = fVar34 + fVar9, fVar33 < fVar34))
              {
                bVar31 = false;
              }
              else {
                iVar22 = iVar22 + 1;
                state->cursor = iVar22;
                bVar31 = true;
              }
            } while ((bVar31) &&
                    (bVar31 = uVar27 < (uVar14 & 0x7fffffff), uVar27 = uVar27 + 1, bVar31));
          }
          ImStb::stb_textedit_clamp(this,state);
          (this->Stb).has_preferred_x = '\x01';
          (this->Stb).preferred_x = fVar33;
          if ((key & 0x400000U) != 0) {
            (this->Stb).select_end = (this->Stb).cursor;
          }
          uVar14 = uVar29 - 1;
          if ((int)uVar29 < 1) {
            uVar14 = 0;
          }
          lVar24 = (long)(int)uVar14;
          uVar15 = uVar14 + 1;
          do {
            uVar28 = (int)uVar14 >> 0x1f & uVar14;
            if (lVar24 < 1) break;
            uVar28 = uVar15 - 1;
            lVar18 = lVar24 + -1;
            lVar24 = lVar24 + -1;
            uVar15 = uVar28;
          } while ((this->TextW).Data[lVar18] != 10);
          iVar30 = iVar30 + 1;
          uVar14 = uVar29;
          uVar29 = uVar28;
        } while (iVar30 != iVar16);
      }
    }
    else {
      key = key & 0x400000U | 0x200000;
      uVar14 = local_44;
      uVar29 = local_3c;
    }
    local_3c = uVar29;
    local_44 = uVar14;
    if (bVar13 || bVar32) goto LAB_00220135;
    goto LAB_0021f67a;
  case 0x200003:
  case 0x20000f:
    goto switchD_0021f694_caseD_200003;
  case 0x200004:
    ImStb::stb_textedit_clamp(this,state);
    iVar16 = (this->Stb).select_start;
    iVar30 = (this->Stb).select_end;
    if (iVar16 != iVar30) {
      if (iVar30 < iVar16) {
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar30;
      }
      iVar16 = (this->Stb).select_start;
      (this->Stb).cursor = iVar16;
      (this->Stb).select_end = iVar16;
      (this->Stb).has_preferred_x = '\0';
    }
    if ((this->Stb).single_line != '\0') {
      state->cursor = 0;
      goto LAB_00220131;
    }
    if ((long)state->cursor < 1) goto LAB_00220131;
    puVar20 = (this->TextW).Data;
    lVar24 = (long)state->cursor;
    goto LAB_00220194;
  case 0x200005:
    iVar16 = this->CurLenW;
    ImStb::stb_textedit_clamp(this,state);
    iVar30 = (this->Stb).select_start;
    iVar22 = (this->Stb).select_end;
    if (iVar30 != iVar22) {
      if (iVar22 < iVar30) {
        (this->Stb).select_end = iVar30;
        (this->Stb).select_start = iVar22;
      }
      iVar30 = (this->Stb).select_start;
      (this->Stb).cursor = iVar30;
      (this->Stb).select_end = iVar30;
      (this->Stb).has_preferred_x = '\0';
    }
    if ((this->Stb).single_line != '\0') {
      state->cursor = iVar16;
      goto LAB_00220131;
    }
    iVar30 = state->cursor;
    if (iVar16 <= iVar30) goto LAB_00220131;
    puVar20 = (this->TextW).Data + iVar30;
    goto LAB_0022016b;
  case 0x200006:
    (this->Stb).select_end = 0;
    (this->Stb).cursor = 0;
    (this->Stb).select_start = 0;
    goto LAB_00220131;
  case 0x200007:
    (this->Stb).cursor = this->CurLenW;
    (this->Stb).select_start = 0;
    (this->Stb).select_end = 0;
    goto LAB_00220131;
  case 0x200008:
switchD_0021f694_caseD_200008:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar16 = (this->Stb).cursor;
      if (iVar16 < this->CurLenW) {
        ImStb::stb_textedit_delete(this,state,iVar16,1);
      }
      goto LAB_00220131;
    }
    break;
  case 0x200009:
switchD_0021f694_caseD_200009:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      ImStb::stb_textedit_clamp(this,state);
      iVar16 = (this->Stb).cursor;
      if (0 < iVar16) {
        ImStb::stb_textedit_delete(this,state,iVar16 + -1,1);
        (this->Stb).cursor = (this->Stb).cursor + -1;
      }
      goto LAB_00220131;
    }
    break;
  case 0x20000a:
    lVar24 = (long)(this->Stb).undostate.undo_point;
    if (lVar24 == 0) goto LAB_00220131;
    iVar16 = (this->Stb).undostate.undo_rec[lVar24 + -1].where;
    iVar30 = (this->Stb).undostate.undo_rec[lVar24 + -1].insert_length;
    uVar14 = (this->Stb).undostate.undo_rec[lVar24 + -1].delete_length;
    lVar18 = (long)(this->Stb).undostate.redo_point;
    iVar22 = (this->Stb).undostate.undo_rec[lVar24 + -1].char_storage;
    (this->Stb).undostate.undo_rec[lVar18 + -1].char_storage = -1;
    (this->Stb).undostate.undo_rec[lVar18 + -1].insert_length = uVar14;
    (this->Stb).undostate.undo_rec[lVar18 + -1].delete_length = iVar30;
    (this->Stb).undostate.undo_rec[lVar18 + -1].where = iVar16;
    if ((ulong)uVar14 == 0) goto LAB_0022041b;
    iVar23 = (this->Stb).undostate.undo_char_point + uVar14;
    if (0x3e6 < iVar23) {
      (this->Stb).undostate.undo_rec[lVar18 + -1].insert_length = 0;
      goto LAB_00220408;
    }
    iVar17 = (this->Stb).undostate.redo_char_point;
    bVar13 = iVar17 < iVar23;
    if (iVar23 <= iVar17) goto LAB_002203b1;
    sVar3 = (this->Stb).undostate.redo_point;
    goto joined_r0x00220235;
  case 0x20000b:
    lVar24 = (long)(this->Stb).undostate.redo_point;
    if (lVar24 != 99) {
      sVar3 = (this->Stb).undostate.undo_point;
      iVar16 = (this->Stb).undostate.undo_rec[lVar24].where;
      iVar30 = (this->Stb).undostate.undo_rec[lVar24].insert_length;
      iVar22 = (this->Stb).undostate.undo_rec[lVar24].delete_length;
      iVar23 = (this->Stb).undostate.undo_rec[lVar24].char_storage;
      (this->Stb).undostate.undo_rec[sVar3].delete_length = iVar30;
      (this->Stb).undostate.undo_rec[sVar3].insert_length = iVar22;
      (this->Stb).undostate.undo_rec[sVar3].where = iVar16;
      (this->Stb).undostate.undo_rec[sVar3].char_storage = -1;
      if (iVar22 != 0) {
        iVar6 = (this->Stb).undostate.undo_char_point;
        iVar17 = iVar6 + iVar22;
        if ((this->Stb).undostate.redo_char_point < iVar17) {
          pSVar10 = (this->Stb).undostate.undo_rec + sVar3;
          pSVar10->insert_length = 0;
          pSVar10->delete_length = 0;
        }
        else {
          (this->Stb).undostate.undo_rec[sVar3].char_storage = iVar6;
          (this->Stb).undostate.undo_char_point = iVar17;
          if (0 < (this->Stb).undostate.undo_rec[sVar3].insert_length) {
            lVar24 = 0;
            do {
              (this->Stb).undostate.undo_char
              [(this->Stb).undostate.undo_rec[sVar3].char_storage + lVar24] =
                   (this->TextW).Data[(this->Stb).undostate.undo_rec[sVar3].where + lVar24];
              lVar24 = lVar24 + 1;
            } while ((int)lVar24 < (this->Stb).undostate.undo_rec[sVar3].insert_length);
          }
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar16,iVar22);
      }
      if (iVar30 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar16,(this->Stb).undostate.undo_char + iVar23,iVar30)
        ;
        piVar21 = &(this->Stb).undostate.redo_char_point;
        *piVar21 = *piVar21 + iVar30;
      }
      (this->Stb).cursor = iVar30 + iVar16;
      uVar4 = (this->Stb).undostate.undo_point;
      uVar7 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar4 + 1;
      (this->Stb).undostate.redo_point = uVar7 + 1;
    }
    goto LAB_00220131;
  case 0x20000c:
    iVar16 = (this->Stb).select_start;
    iVar30 = (this->Stb).select_end;
    if (iVar16 == iVar30) {
      uVar14 = state->cursor;
      uVar29 = (int)uVar14 >> 0x1f & uVar14;
      goto LAB_0021febc;
    }
    if (iVar30 < iVar16) {
      (this->Stb).select_end = iVar16;
      (this->Stb).select_start = iVar30;
    }
    iVar16 = (this->Stb).select_start;
    (this->Stb).cursor = iVar16;
    goto LAB_0022012e;
  case 0x20000d:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar16 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
      (this->Stb).cursor = iVar16;
      goto LAB_002201cc;
    }
    ImStb::stb_textedit_move_to_last(this,state);
    goto LAB_00220135;
  default:
    switch(key) {
    case 0x600000:
      ImStb::stb_textedit_clamp(this,state);
      iVar16 = (this->Stb).select_end;
      if ((this->Stb).select_start == iVar16) {
        iVar16 = (this->Stb).cursor;
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
      }
      else {
        state->cursor = iVar16;
      }
      iVar16 = (this->Stb).select_end;
      if (0 < iVar16) {
        (this->Stb).select_end = iVar16 + -1;
      }
      break;
    case 0x600001:
      iVar16 = (this->Stb).select_end;
      if ((this->Stb).select_start == iVar16) {
        iVar16 = (this->Stb).cursor;
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
      }
      else {
        state->cursor = iVar16;
      }
      piVar21 = &(this->Stb).select_end;
      *piVar21 = *piVar21 + 1;
      ImStb::stb_textedit_clamp(this,state);
      break;
    case 0x600002:
    case 0x60000e:
      goto switchD_0021f694_caseD_200002;
    case 0x600003:
    case 0x60000f:
      goto switchD_0021f694_caseD_200003;
    case 0x600004:
      ImStb::stb_textedit_clamp(this,state);
      iVar16 = (this->Stb).select_end;
      if ((this->Stb).select_start == iVar16) {
        iVar16 = (this->Stb).cursor;
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
      }
      else {
        state->cursor = iVar16;
      }
      if ((this->Stb).single_line != '\0') {
        state->cursor = 0;
        goto LAB_0022012b;
      }
      if ((long)state->cursor < 1) goto LAB_0022012b;
      puVar20 = (this->TextW).Data;
      lVar24 = (long)state->cursor;
      goto LAB_0022010d;
    case 0x600005:
      iVar16 = this->CurLenW;
      ImStb::stb_textedit_clamp(this,state);
      iVar30 = (this->Stb).select_end;
      if ((this->Stb).select_start == iVar30) {
        iVar30 = (this->Stb).cursor;
        (this->Stb).select_end = iVar30;
        (this->Stb).select_start = iVar30;
      }
      else {
        state->cursor = iVar30;
      }
      if ((this->Stb).single_line != '\0') {
        state->cursor = iVar16;
        goto LAB_0022012b;
      }
      iVar30 = state->cursor;
      if (iVar16 <= iVar30) goto LAB_0022012b;
      puVar20 = (this->TextW).Data + iVar30;
      goto LAB_002200e4;
    case 0x600006:
      iVar16 = (this->Stb).select_end;
      if ((this->Stb).select_start == iVar16) {
        iVar16 = (this->Stb).cursor;
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
      }
      else {
        state->cursor = iVar16;
      }
      iVar16 = 0;
      goto LAB_00220071;
    case 0x600007:
      iVar16 = (this->Stb).select_end;
      if ((this->Stb).select_start == iVar16) {
        iVar16 = (this->Stb).cursor;
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
      }
      else {
        state->cursor = iVar16;
      }
      iVar16 = this->CurLenW;
LAB_00220071:
      (this->Stb).select_end = iVar16;
      goto LAB_00220074;
    case 0x600008:
      goto switchD_0021f694_caseD_200008;
    case 0x600009:
      goto switchD_0021f694_caseD_200009;
    default:
      uVar14 = 0;
      if (key < 0x200000) {
        uVar14 = key;
      }
      if ((int)uVar14 < 1) goto LAB_00220135;
      local_50[0] = (float)CONCAT22(local_50[0]._2_2_,(short)uVar14);
      if ((uVar14 == 10) && ((this->Stb).single_line != '\0')) goto LAB_00220135;
      if (((this->Stb).insert_mode == '\0') || ((this->Stb).select_start != (this->Stb).select_end))
      {
LAB_002201d6:
        ImStb::stb_textedit_delete_selection(this,state);
        bVar13 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,(ImWchar *)local_50,1);
        if (!bVar13) goto LAB_00220135;
        ImStb::stb_text_createundo(&(this->Stb).undostate,(this->Stb).cursor,0,1);
      }
      else {
        iVar16 = (this->Stb).cursor;
        if (this->CurLenW <= iVar16) goto LAB_002201d6;
        pIVar19 = ImStb::stb_text_createundo(&(this->Stb).undostate,iVar16,1,1);
        if (pIVar19 != (ImWchar *)0x0) {
          *pIVar19 = (this->TextW).Data[iVar16];
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,(this->Stb).cursor,1);
        bVar13 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,(ImWchar *)local_50,1);
        if (!bVar13) goto LAB_00220135;
      }
      (this->Stb).cursor = (this->Stb).cursor + 1;
      goto LAB_00220131;
    case 0x60000c:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        iVar16 = (this->Stb).cursor;
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
      }
      uVar14 = state->cursor;
      uVar29 = (int)uVar14 >> 0x1f & uVar14;
      goto LAB_0021fcc2;
    case 0x60000d:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        iVar16 = (this->Stb).cursor;
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
      }
      iVar16 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
      (this->Stb).cursor = iVar16;
      (this->Stb).select_end = iVar16;
      goto LAB_002201cc;
    }
    iVar16 = (this->Stb).select_end;
LAB_00220074:
    (this->Stb).cursor = iVar16;
    goto LAB_00220131;
  }
  ImStb::stb_textedit_delete_selection(this,state);
  goto LAB_00220131;
  while( true ) {
    uVar14 = uVar14 - 1;
    iVar16 = ImStb::is_word_boundary_from_right(this,uVar14);
    uVar28 = uVar14;
    if (iVar16 != 0) break;
LAB_0021fcc2:
    uVar28 = uVar29 - 1;
    if ((int)uVar14 < 1) break;
  }
  uVar14 = 0;
  if (0 < (int)uVar28) {
    uVar14 = uVar28;
  }
  (this->Stb).cursor = uVar14;
  (this->Stb).select_end = uVar14;
  goto LAB_002201cc;
  while( true ) {
    state->cursor = iVar30;
    puVar20 = puVar20 + 1;
    if (iVar30 == iVar16) break;
LAB_002200e4:
    iVar30 = iVar30 + 1;
    if (*puVar20 == 10) break;
  }
  goto LAB_0022012b;
  while( true ) {
    state->cursor = (int)lVar24 + -1;
    bVar13 = lVar24 < 2;
    lVar24 = lVar24 + -1;
    if (bVar13) break;
LAB_0022010d:
    if (puVar20[lVar24 + -1] == 10) break;
  }
LAB_0022012b:
  iVar16 = (this->Stb).cursor;
LAB_0022012e:
  (this->Stb).select_end = iVar16;
  goto LAB_00220131;
  while( true ) {
    uVar14 = uVar14 - 1;
    iVar16 = ImStb::is_word_boundary_from_right(this,uVar14);
    uVar28 = uVar14;
    if (iVar16 != 0) break;
LAB_0021febc:
    uVar28 = uVar29 - 1;
    if ((int)uVar14 < 1) break;
  }
  uVar14 = 0;
  if (0 < (int)uVar28) {
    uVar14 = uVar28;
  }
  (this->Stb).cursor = uVar14;
LAB_002201cc:
  ImStb::stb_textedit_clamp(this,state);
  goto LAB_00220135;
joined_r0x00220235:
  if (sVar3 == 99) goto LAB_00220131;
  if (sVar3 < 99) {
    if (-1 < (this->Stb).undostate.undo_rec[0x62].char_storage) {
      iVar23 = (this->Stb).undostate.undo_rec[0x62].insert_length;
      lVar24 = (long)(this->Stb).undostate.redo_char_point + (long)iVar23;
      iVar17 = (int)lVar24;
      (this->Stb).undostate.redo_char_point = iVar17;
      pIVar19 = (this->Stb).undostate.undo_char + lVar24;
      memmove(pIVar19,pIVar19 + -(long)iVar23,(long)(999 - iVar17) * 2);
      lVar24 = (long)(this->Stb).undostate.redo_point;
      if (lVar24 < 0x62) {
        lVar18 = lVar24 + -0x62;
        piVar21 = &(this->Stb).undostate.undo_rec[lVar24].char_storage;
        do {
          if (-1 < *piVar21) {
            *piVar21 = *piVar21 + iVar23;
          }
          piVar21 = piVar21 + 4;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0);
      }
    }
    lVar24 = (long)(this->Stb).undostate.redo_point;
    memmove((this->Stb).undostate.undo_rec + lVar24 + 1,(this->Stb).undostate.undo_rec + lVar24,
            lVar24 * -0x10 + 0x620);
    psVar1 = &(this->Stb).undostate.redo_point;
    *psVar1 = *psVar1 + 1;
  }
  iVar23 = (this->Stb).undostate.undo_char_point + uVar14;
  iVar17 = (this->Stb).undostate.redo_char_point;
  bVar13 = iVar17 < iVar23;
  if (iVar23 <= iVar17) goto LAB_002203b1;
  sVar3 = (this->Stb).undostate.redo_point;
  goto joined_r0x00220235;
LAB_002203b1:
  lVar24 = (long)(this->Stb).undostate.redo_point;
  (this->Stb).undostate.undo_rec[lVar24 + -1].char_storage = iVar17 - uVar14;
  (this->Stb).undostate.redo_char_point = iVar17 - uVar14;
  if (0 < (int)uVar14) {
    uVar27 = 0;
    do {
      (this->Stb).undostate.undo_char
      [(long)(this->Stb).undostate.undo_rec[lVar24 + -1].char_storage + uVar27] =
           (this->TextW).Data[(long)iVar16 + uVar27];
      uVar27 = uVar27 + 1;
    } while (uVar14 != uVar27);
  }
  if (!bVar13) {
LAB_00220408:
    ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar16,uVar14);
LAB_0022041b:
    if (iVar30 != 0) {
      ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar16,(this->Stb).undostate.undo_char + iVar22,iVar30);
      piVar21 = &(this->Stb).undostate.undo_char_point;
      *piVar21 = *piVar21 - iVar30;
    }
    (this->Stb).cursor = iVar30 + iVar16;
    uVar5 = (this->Stb).undostate.undo_point;
    uVar8 = (this->Stb).undostate.redo_point;
    (this->Stb).undostate.undo_point = uVar5 + -1;
    (this->Stb).undostate.redo_point = uVar8 + -1;
  }
  goto LAB_00220131;
  while( true ) {
    state->cursor = iVar30;
    puVar20 = puVar20 + 1;
    if (iVar30 == iVar16) break;
LAB_0022016b:
    iVar30 = iVar30 + 1;
    if (*puVar20 == 10) break;
  }
  goto LAB_00220131;
switchD_0021f694_caseD_200003:
  iVar16 = 1;
  bVar13 = (key & 0xffbfffffU) == 0x20000f;
  if (bVar13) {
    iVar16 = (this->Stb).row_count_per_page;
  }
  bVar32 = (this->Stb).single_line == '\0';
  if (bVar13 || bVar32) {
    iVar30 = (this->Stb).select_start;
    iVar22 = (this->Stb).select_end;
    if ((key & 0x400000U) == 0) {
      if (iVar30 != iVar22) {
        ImStb::stb_textedit_move_to_last(this,state);
      }
    }
    else if (iVar30 == iVar22) {
      iVar30 = (this->Stb).cursor;
      (this->Stb).select_end = iVar30;
      (this->Stb).select_start = iVar30;
    }
    else {
      state->cursor = iVar22;
    }
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_find_charpos
              ((ImStb *)local_50,(StbFindState *)this,
               (ImGuiInputTextState *)(ulong)(uint)(this->Stb).cursor,(uint)(this->Stb).single_line,
               (int)in_R8);
    fVar12 = local_50[0];
    uVar14 = local_44;
    uVar29 = local_40;
    if (0 < iVar16) {
      uVar27 = (ulong)local_40;
      iVar30 = 0;
      do {
        uVar29 = (uint)uVar27;
        fVar33 = fVar12;
        if ((this->Stb).has_preferred_x != '\0') {
          fVar33 = (this->Stb).preferred_x;
        }
        if (uVar29 == 0) break;
        uVar28 = uVar14 + uVar29;
        puVar20 = (this->TextW).Data;
        if (puVar20[(long)(int)uVar28 + -1] != 10) break;
        (this->Stb).cursor = uVar28;
        local_38 = (ImWchar *)0x0;
        InputTextCalcTextSizeW
                  (puVar20 + (int)uVar28,puVar20 + this->CurLenW,&local_38,(ImVec2 *)0x1,
                   SUB81(in_R8,0));
        pIVar11 = GImGui;
        uVar27 = (ulong)((long)local_38 - (long)(puVar20 + (int)uVar28)) >> 1;
        uVar29 = (uint)uVar27;
        if (0 < (int)uVar29) {
          puVar20 = (this->TextW).Data;
          iVar22 = (this->Stb).cursor;
          fVar34 = 0.0;
          uVar25 = 1;
          do {
            uVar2 = puVar20[(long)(int)uVar28 + (uVar25 - 1)];
            fVar9 = -1.0;
            if (uVar2 != 10) {
              in_R8 = pIVar11->Font;
              pfVar26 = &in_R8->FallbackAdvanceX;
              if ((int)(uint)uVar2 < (in_R8->IndexAdvanceX).Size) {
                pfVar26 = (float *)((ulong)((uint)uVar2 * 4) + (long)(in_R8->IndexAdvanceX).Data);
              }
              fVar9 = (pIVar11->FontSize / in_R8->FontSize) * *pfVar26;
            }
            if (((fVar9 == -1.0) && (!NAN(fVar9))) || (fVar34 = fVar34 + fVar9, fVar33 < fVar34)) {
              bVar31 = false;
            }
            else {
              iVar22 = iVar22 + 1;
              state->cursor = iVar22;
              bVar31 = true;
            }
          } while ((bVar31) &&
                  (bVar31 = uVar25 < (uVar29 & 0x7fffffff), uVar25 = uVar25 + 1, bVar31));
        }
        ImStb::stb_textedit_clamp(this,state);
        (this->Stb).has_preferred_x = '\x01';
        (this->Stb).preferred_x = fVar33;
        if ((key & 0x400000U) != 0) {
          (this->Stb).select_end = (this->Stb).cursor;
        }
        iVar30 = iVar30 + 1;
        uVar14 = uVar28;
      } while (iVar30 != iVar16);
    }
  }
  else {
    key = key & 0x400000U | 0x200001;
    uVar14 = local_44;
    uVar29 = local_40;
  }
  local_40 = uVar29;
  local_44 = uVar14;
  if (bVar13 || bVar32) goto LAB_00220135;
  goto LAB_0021f67a;
  while( true ) {
    state->cursor = (int)lVar24 + -1;
    bVar13 = lVar24 < 2;
    lVar24 = lVar24 + -1;
    if (bVar13) break;
LAB_00220194:
    if (puVar20[lVar24 + -1] == 10) break;
  }
LAB_00220131:
  (this->Stb).has_preferred_x = '\0';
LAB_00220135:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}